

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O2

Own<capnp::ClientHook> __thiscall capnp::QueuedClient::addRef(QueuedClient *this)

{
  ClientHook *extraout_RDX;
  _func_int **in_RSI;
  Own<capnp::ClientHook> OVar1;
  Own<capnp::QueuedClient> local_18;
  
  *(int *)(in_RSI + 2) = *(int *)(in_RSI + 2) + 1;
  local_18.disposer = (Disposer *)(in_RSI + 1);
  (this->super_ClientHook)._vptr_ClientHook = (_func_int **)local_18.disposer;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = in_RSI;
  local_18.ptr = (QueuedClient *)0x0;
  kj::Own<capnp::QueuedClient>::dispose(&local_18);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

kj::Own<ClientHook> addRef() override {
    return kj::addRef(*this);
  }